

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

int __thiscall smf::MidiFile::getSplitTrack(MidiFile *this,int track,int index)

{
  MidiEvent *pMVar1;
  
  if (this->m_theTrackState != 0) {
    pMVar1 = MidiEventList::operator[]
                       ((this->m_events).
                        super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[track],index);
    track = pMVar1->track;
  }
  return track;
}

Assistant:

int MidiFile::getSplitTrack(int track, int index) const {
	if (hasSplitTracks()) {
		return track;
	} else {
		return getEvent(track, index).track;
	}
}